

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCppMemory.h
# Opt level: O1

void __thiscall cppforth::Forth::memAllocate(Forth *this)

{
  ForthStack<unsigned_int> *this_00;
  uint Value;
  uint uVar1;
  VirtualMemorySegment variables;
  allocator_type local_41;
  value_type local_40;
  
  requireDStackDepth(this,1,"ALLOCATE");
  requireDStackAvailable(this,1,"ALLOCATE");
  this_00 = &this->dStack;
  uVar1 = ForthStack<unsigned_int>::getTop(this_00);
  Value = this->VirtualMemoryFreeSegment;
  ForthStack<unsigned_int>::push(this_00,0);
  if (this->vmMaxSegmentSize < uVar1) {
    ForthStack<unsigned_int>::setTop(this_00,1,0);
    ForthStack<unsigned_int>::setTop(this_00,0xffffffc5);
  }
  else {
    local_40.end = this->VirtualMemoryFreeSegment + uVar1;
    this->VirtualMemoryFreeSegment = local_40.end;
    local_40.start = Value;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              (&local_40.segment,(ulong)uVar1,&local_41);
    std::
    vector<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>
    ::push_back(&this->VirtualMemory,&local_40);
    ForthStack<unsigned_int>::setTop(this_00,1,Value);
    if (local_40.segment.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_40.segment.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_40.segment.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_40.segment.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void memAllocate() {
			REQUIRE_DSTACK_DEPTH(1, "ALLOCATE");
			REQUIRE_DSTACK_AVAILABLE(1, "ALLOCATE");
			auto size = dStack.getTop();
			Cell start = VirtualMemoryFreeSegment;
			dStack.push(0);
			try{
				if (size <= vmMaxSegmentSize){
					VirtualMemoryFreeSegment += static_cast<Cell>(size);
					VirtualMemorySegment variables{ start, VirtualMemoryFreeSegment, std::vector<Char>(size) };
					VirtualMemory.push_back(variables);
					dStack.setTop(1,CELL(start));
				}
				else {
					dStack.setTop(1,CELL(0));
					dStack.setTop(CELL(errorAllocate));
				}
			}
			catch (...){
				dStack.setTop(1, CELL(0));
				dStack.setTop(CELL(errorAllocate));
			}
		}